

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O1

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  complex<double> *pcVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  lVar3 = sourceindex->fNElements;
  if (0 < lVar3) {
    lVar14 = 0;
    do {
      iVar9 = Local(this,destinationindex->fStore[lVar14]);
      lVar13 = (long)iVar9;
      lVar15 = lVar14;
      do {
        iVar9 = Local(this,destinationindex->fStore[lVar15]);
        lVar4 = sourceindex->fStore[lVar14];
        lVar5 = sourceindex->fStore[lVar15];
        if ((((lVar4 < 0) ||
             ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow <= lVar4)) ||
            (lVar5 < 0)) ||
           ((elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol <= lVar5)) {
          TPZFMatrix<std::complex<double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar10 = (long)iVar9;
        lVar12 = lVar10;
        if (lVar10 < lVar13) {
          lVar12 = lVar13;
        }
        if (lVar13 < lVar10) {
          lVar10 = lVar13;
        }
        lVar12 = (lVar12 + 1) * lVar12;
        uVar11 = lVar12 - (lVar12 >> 0x3f) & 0xfffffffffffffffe;
        pcVar6 = (this->super_TPZFront<std::complex<double>_>).fData.fStore;
        dVar7 = *(double *)
                 (elmat->fElem
                  [lVar5 * (elmat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow
                   + lVar4]._M_value + 8);
        pdVar1 = (double *)(pcVar6[lVar10]._M_value + uVar11 * 8);
        dVar8 = pdVar1[1];
        pdVar2 = (double *)(pcVar6[lVar10]._M_value + uVar11 * 8);
        *pdVar2 = *pdVar1 + *(double *)
                             elmat->fElem
                             [lVar5 * (elmat->super_TPZMatrix<std::complex<double>_>).
                                      super_TPZBaseMatrix.fRow + lVar4]._M_value;
        pdVar2[1] = dVar8 + dVar7;
        lVar15 = lVar15 + 1;
      } while (lVar15 < lVar3);
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = i; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}